

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O2

void flatbuffers::cpp::CppGenerator::PaddingNoop(int bits,string *code_ptr,int *id)

{
  int t;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  if (code_ptr->_M_string_length != 0) {
    std::__cxx11::string::push_back((char)code_ptr);
  }
  t = *id;
  *id = t + 1;
  NumToString<int>(&local_30,t);
  std::operator+(&local_70,"    (void)padding",&local_30);
  std::operator+(&local_50,&local_70,"__;");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

static void PaddingNoop(int bits, std::string *code_ptr, int *id) {
    (void)bits;
    if (!code_ptr->empty()) *code_ptr += '\n';
    *code_ptr += "    (void)padding" + NumToString((*id)++) + "__;";
  }